

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result-c.cpp
# Opt level: O3

bool duckdb_result_is_streaming(duckdb_result result)

{
  char *this;
  char *pcVar1;
  pointer pQVar2;
  
  this = result.deprecated_error_message;
  if ((result.deprecated_error_message != (char *)0x0) &&
     (pcVar1 = duckdb_result_error((duckdb_result *)&stack0x00000008), pcVar1 == (char *)0x0)) {
    pQVar2 = duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>
             ::operator->((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>
                           *)this);
    return (pQVar2->super_BaseQueryResult).type == STREAM_RESULT;
  }
  return false;
}

Assistant:

bool duckdb_result_is_streaming(duckdb_result result) {
	if (!result.internal_data) {
		return false;
	}
	if (duckdb_result_error(&result) != nullptr) {
		return false;
	}
	auto &result_data = *(reinterpret_cast<duckdb::DuckDBResultData *>(result.internal_data));
	return result_data.result->type == duckdb::QueryResultType::STREAM_RESULT;
}